

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall toml::type_error::type_error(type_error *this,string *what_arg,source_location *loc)

{
  exception::exception(&this->super_exception,loc);
  *(undefined ***)&this->super_exception = &PTR__type_error_001f4ff0;
  std::__cxx11::string::string((string *)&this->what_,(string *)what_arg);
  return;
}

Assistant:

explicit type_error(const std::string& what_arg, const source_location& loc)
        : exception(loc), what_(what_arg)
    {}